

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O1

char * dfeature_at(int x,int y,char *buf)

{
  byte bVar1;
  level *plVar2;
  boolean bVar3;
  aligntyp alignment;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  
  plVar2 = level;
  bVar1 = level->locations[x][y].typ;
  switch(bVar1) {
  case 0x17:
    uVar4 = *(uint *)&level->locations[x][y].field_0x6 >> 4 & 0x1f;
    if (uVar4 < 3) {
      uVar5 = *(uint *)(&DAT_002af1c4 + (ulong)uVar4 * 4);
      pcVar7 = *(char **)(&DAT_003053e0 + (ulong)uVar4 * 8);
    }
    else {
      uVar5 = 0x1b;
      pcVar7 = (char *)0x0;
    }
    iVar8 = is_drawbridge_wall(x,y);
    uVar4 = 0xffffffff;
    if (iVar8 < 0) {
      uVar4 = uVar5;
    }
    pcVar6 = "open drawbridge portcullis";
    if (iVar8 < 0) {
      pcVar6 = pcVar7;
    }
    goto LAB_001b123c;
  default:
    bVar3 = is_lava(level,x,y);
    if (bVar3 == '\0') {
      bVar3 = is_swamp(level,x,y);
      if (bVar3 == '\0') {
        bVar3 = is_ice(level,x,y);
        if (bVar3 == '\0') {
          bVar3 = is_pool(level,x,y);
          uVar4 = 0xffffffff;
          if (bVar3 != '\0') {
            pcVar6 = "pool of water";
            goto LAB_001b123c;
          }
          if (bVar1 == 0x1f) {
            uVar4 = 0x2a;
            break;
          }
          if (bVar1 == 0x21) {
            pcVar6 = a_gname();
            uVar5 = *(uint *)&plVar2->locations[x][y].field_0x6 >> 4 & 0x17;
            if (uVar5 == 0) {
              alignment = -0x80;
            }
            else if (uVar5 == 4) {
              alignment = '\x01';
            }
            else {
              alignment = (char)uVar5 + -2;
            }
            pcVar7 = align_str(alignment);
            sprintf(dfeature_at::altbuf,"altar to %s (%s)",pcVar6,pcVar7);
            pcVar6 = dfeature_at::altbuf;
            goto LAB_001b123c;
          }
          iVar8 = (int)(level->sstairs).sx;
          if (iVar8 == x) {
            if (((level->sstairs).sy == y) && ((level->sstairs).up != '\0')) {
              uVar4 = 0x24;
            }
            else {
              if ((iVar8 != x) || ((level->sstairs).sy != y)) goto LAB_001b131e;
              uVar4 = 0x25;
            }
          }
          else {
LAB_001b131e:
            if (((level->upstair).sx == x) && ((level->upstair).sy == y)) {
              uVar4 = 0x20;
            }
            else if (((level->dnstair).sx == x) && ((level->dnstair).sy == y)) {
              uVar4 = 0x21;
            }
            else if (((level->upladder).sx == x) && ((level->upladder).sy == y)) {
              uVar4 = 0x22;
            }
            else if (((level->dnladder).sx == x) && ((level->dnladder).sy == y)) {
              uVar4 = 0x23;
            }
            else if (bVar1 < 0x16) {
              if (bVar1 == 0xc) {
                uVar4 = 0x2e;
              }
              else if (bVar1 == 0xd) {
                uVar4 = 0x1e;
              }
              else if (bVar1 == 0xe) {
                uVar4 = 0x1f;
              }
            }
            else {
              if (bVar1 == 0x16) {
                pcVar6 = "set of iron bars";
                uVar4 = 0xffffffff;
                goto LAB_001b123c;
              }
              if (bVar1 == 0x20) {
                uVar4 = 0x27;
              }
              else if (bVar1 == 0x24) {
                uVar4 = 0x2c;
              }
            }
          }
          break;
        }
        uVar4 = 0x15;
      }
      else {
        uVar4 = 0x16;
      }
    }
    else {
      uVar4 = 0x17;
    }
    pcVar6 = (char *)0x0;
    goto LAB_001b123c;
  case 0x1c:
    uVar4 = 0x2b;
    break;
  case 0x1d:
    uVar4 = 0x28;
    break;
  case 0x1e:
    uVar4 = 0x29;
  }
  pcVar6 = (char *)0x0;
LAB_001b123c:
  if (-1 < (int)uVar4) {
    pcVar6 = defexplain[uVar4];
  }
  if (pcVar6 != (char *)0x0) {
    strcpy(buf,pcVar6);
  }
  return pcVar6;
}

Assistant:

const char *dfeature_at(int x, int y, char *buf)
{
	struct rm *loc = &level->locations[x][y];
	int ltyp = loc->typ, cmap = -1;
	const char *dfeature = 0;
	static char altbuf[BUFSZ];

	if (IS_DOOR(ltyp)) {
	    switch (loc->doormask) {
	    case D_NODOOR:	cmap = S_ndoor; break;	/* "doorway" */
	    case D_ISOPEN:	cmap = S_vodoor; break;	/* "open door" */
	    case D_BROKEN:	dfeature = "broken door"; break;
	    default:	cmap = S_vcdoor; break;	/* "closed door" */
	    }
	    /* override door description for open drawbridge */
	    if (is_drawbridge_wall(x, y) >= 0)
		dfeature = "open drawbridge portcullis",  cmap = -1;
	} else if (IS_FOUNTAIN(ltyp))
	    cmap = S_fountain;				/* "fountain" */
	else if (IS_THRONE(ltyp))
	    cmap = S_throne;				/* "opulent throne" */
	else if (IS_MAGIC_CHEST(ltyp))
	    cmap = S_magic_chest;			/* "magic chest" */
	else if (is_lava(level, x,y))
	    cmap = S_lava;				/* "molten lava" */
	else if (is_swamp(level, x,y))
	    cmap = S_bog;				/* "muddy swamp" */
	else if (is_ice(level, x, y))
	    cmap = S_ice;				/* "ice" */
	else if (is_pool(level, x,y))
	    dfeature = "pool of water";
	else if (IS_SINK(ltyp))
	    cmap = S_sink;				/* "sink" */
	else if (IS_ALTAR(ltyp)) {
	    sprintf(altbuf, "altar to %s (%s)", a_gname(),
		    align_str(Amask2align(loc->altarmask & ~AM_SHRINE)));
	    dfeature = altbuf;
	} else if (x == level->sstairs.sx && y == level->sstairs.sy && level->sstairs.up)
            cmap = S_upsstair;                          /* "long ladder up" */
        else if (x == level->sstairs.sx && y == level->sstairs.sy)
            cmap = S_dnsstair;                          /* "long ladder down" */
        else if (x == level->upstair.sx && y == level->upstair.sy)
	    cmap = S_upstair;				/* "staircase up" */
	else if (x == level->dnstair.sx && y == level->dnstair.sy)
	    cmap = S_dnstair;				/* "staircase down" */
	else if (x == level->upladder.sx && y == level->upladder.sy)
	    cmap = S_upladder;				/* "ladder up" */
	else if (x == level->dnladder.sx && y == level->dnladder.sy)
	    cmap = S_dnladder;				/* "ladder down" */
	else if (ltyp == DRAWBRIDGE_DOWN)
	    cmap = S_vodbridge;			/* "lowered drawbridge" */
	else if (ltyp == DBWALL)
	    cmap = S_vcdbridge;			/* "raised drawbridge" */
	else if (IS_GRAVE(ltyp))
	    cmap = S_grave;				/* "grave" */
	else if (ltyp == TREE)
	    cmap = S_tree;				/* "tree" */
	else if (ltyp == DEADTREE)
	    cmap = S_deadtree;				/* "dead tree" */
	else if (ltyp == IRONBARS)
	    dfeature = "set of iron bars";

	if (cmap >= 0) dfeature = defexplain[cmap];
	if (dfeature) strcpy(buf, dfeature);
	return dfeature;
}